

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

int __thiscall
nonstd::any_lite::any::holder<(anonymous_namespace)::InitList>::clone
          (holder<(anonymous_namespace)::InitList> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x30);
  *puVar1 = &PTR__holder_00150b18;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(puVar1 + 1),&(this->held).vec);
  *(char *)(puVar1 + 4) = (this->held).c;
  *(undefined8 *)((long)puVar1 + 0x24) = 0x300000003;
  *(int *)((long)puVar1 + 0x2c) = (this->held).s.value.value;
  return (int)puVar1;
}

Assistant:

virtual placeholder * clone() const any_override
        {
            return new holder( held );
        }